

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test_stl_sorting(void)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  ostream *poVar4;
  bool bVar5;
  int iVar6;
  smoothsort_ptr<double> *psVar7;
  vector<double,_std::allocator<double>_> to_sort;
  sorted_ptr_arr<double> local_68;
  vector<double,_std::allocator<double>_> local_58;
  double local_38;
  undefined8 uStack_30;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(&local_58,10);
  iVar6 = 10;
  do {
    iVar2 = rand();
    local_68.ptr_arr =
         (smoothsort_ptr<double> *)(double)(int)(((double)iVar2 * 100.0) / 2147483647.0);
    if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_58,
                 (iterator)
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_68);
    }
    else {
      *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = (double)local_68.ptr_arr;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  sorted_ptr_arr<double>::assign<std::vector<double,std::allocator<double>>>(&local_68,&local_58);
  sorted_ptr_arr<double>::sort(&local_68);
  if (local_68.N == 0) {
    bVar5 = false;
  }
  else {
    local_38 = (double)(int)*(local_68.ptr_arr)->element;
    uStack_30 = 0;
    bVar5 = false;
    psVar7 = local_68.ptr_arr;
    do {
      bVar1 = *psVar7->element < local_38;
      poVar4 = std::ostream::_M_insert<double>(*psVar7->element);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      bVar5 = (bool)(bVar5 | bVar1);
      psVar7 = psVar7 + 1;
    } while (psVar7 != local_68.ptr_arr + local_68.N);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# NOT SORTED",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  if (local_68.ptr_arr != (smoothsort_ptr<double> *)0x0) {
    operator_delete__(local_68.ptr_arr);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_stl_sorting() {
	srand(time(NULL));
	std::vector<double> to_sort;
	to_sort.reserve(10);
	for(unsigned int i=0; i<10; i++) {
		to_sort.push_back((int)(100*(double)rand()/(double)RAND_MAX));
	}
	
	sorted_ptr_arr<double> sorted_data(to_sort);
	int last = sorted_data[0];
	bool not_sorted = false;
	for(sorted_ptr_arr<double>::iterator it=sorted_data.begin(); it != sorted_data.end(); ++it) {
		if(last > *it) { not_sorted = true; }
		std::cout << *it << "\t";
	}
	std::cout << std::endl;
	if(not_sorted) { std::cout << "# NOT SORTED" << std::endl; }
}